

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
booster::locale::ios_info::string_set::get<char>(string_set *this)

{
  bool bVar1;
  undefined8 uVar2;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  type_info *in_stack_ffffffffffffffa8;
  char *pcVar3;
  bad_cast *in_stack_ffffffffffffffb0;
  allocator *paVar4;
  allocator local_12;
  undefined1 local_11;
  
  if ((*in_RSI != 0) &&
     (bVar1 = std::type_info::operator!=
                        ((type_info *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), !bVar1))
  {
    local_11 = 0;
    pcVar3 = (char *)in_RSI[2];
    paVar4 = &local_12;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar3,paVar4);
    std::allocator<char>::~allocator((allocator<char> *)&local_12);
    return in_RDI;
  }
  uVar2 = __cxa_allocate_exception(8);
  std::bad_cast::bad_cast(in_stack_ffffffffffffffb0);
  __cxa_throw(uVar2,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::basic_string<Char> get() const
                {
                    if(type==0 || *type!=typeid(Char))
                        throw std::bad_cast();
                    std::basic_string<Char> result = reinterpret_cast<Char const *>(ptr);
                    return result;
                }